

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validatePositive(Result *__return_storage_ptr__,int value,string *name)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  undefined8 *puVar4;
  long *plVar5;
  uint uVar6;
  size_type *psVar7;
  uint __val;
  ulong uVar8;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  string err;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  string local_50;
  
  if (0 < value) {
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  __val = -value;
  __len = 1;
  if (9 < __val) {
    uVar6 = __val;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0035a4e6;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0035a4e6;
      }
      if (uVar6 < 10000) goto LAB_0035a4e6;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar3 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_0035a4e6:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)(value >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)value >> 0x1f) + (long)local_70),__len,__val);
  uVar8 = 0xf;
  if (local_90 != local_80) {
    uVar8 = local_80[0];
  }
  if (uVar8 < (ulong)(local_68 + local_88)) {
    uVar8 = 0xf;
    if (local_70 != local_60) {
      uVar8 = local_60[0];
    }
    if ((ulong)(local_68 + local_88) <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
      goto LAB_0035a572;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
LAB_0035a572:
  local_b0 = &local_a0;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_a0 = *plVar5;
    uStack_98 = puVar4[3];
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*puVar4;
  }
  local_a8 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_50.field_2._M_allocated_capacity = *psVar7;
    local_50.field_2._8_8_ = plVar5[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar7;
    local_50._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_50._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validatePositive(const int value, const std::string& name) {
    if (value <= 0 ) {
        std::string err = name + " must be positive, got " + std::to_string(value) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    Result r;
    return r;
}